

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_real_equal_u32string_literal(void)

{
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_48,0.0);
  local_a[0] = trial::dynamic::operator==(&local_48,(char32_t (*) [6])L"delta");
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) == U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x69f,"void equality_suite::compare_real_equal_u32string_literal()",local_a,&local_49)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_98,0.0);
  local_5e[0] = trial::dynamic::operator!=(&local_98,(char32_t (*) [6])L"delta");
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0f) != U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6a0,"void equality_suite::compare_real_equal_u32string_literal()",local_5e,&local_99
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_d8,1.0);
  local_9b[0] = trial::dynamic::operator==(&local_d8,(char32_t (*) [6])L"delta");
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1.0f) == U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6a1,"void equality_suite::compare_real_equal_u32string_literal()",local_9b,&local_d9
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_118,1.0);
  local_db[0] = trial::dynamic::operator!=(&local_118,(char32_t (*) [6])L"delta");
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1.0f) != U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6a2,"void equality_suite::compare_real_equal_u32string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_158,0.0);
  local_11b[0] = trial::dynamic::operator==(&local_158,(char32_t (*) [6])L"delta");
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) == U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6a6,"void equality_suite::compare_real_equal_u32string_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_198,0.0);
  local_15b[0] = trial::dynamic::operator!=(&local_198,(char32_t (*) [6])L"delta");
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0) != U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6a7,"void equality_suite::compare_real_equal_u32string_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_1d8,1.0);
  local_19b[0] = trial::dynamic::operator==(&local_1d8,(char32_t (*) [6])L"delta");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1.0) == U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6a8,"void equality_suite::compare_real_equal_u32string_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_218,1.0);
  local_1db[0] = trial::dynamic::operator!=(&local_218,(char32_t (*) [6])L"delta");
  local_219 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1.0) != U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6a9,"void equality_suite::compare_real_equal_u32string_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_258,(longdouble)0);
  local_21b[0] = trial::dynamic::operator==(&local_258,(char32_t (*) [6])L"delta");
  local_259 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) == U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6ad,"void equality_suite::compare_real_equal_u32string_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_298,(longdouble)0);
  local_25b[0] = trial::dynamic::operator!=(&local_298,(char32_t (*) [6])L"delta");
  local_299 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0.0L) != U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6ae,"void equality_suite::compare_real_equal_u32string_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_2d8,(longdouble)1);
  local_29b[0] = trial::dynamic::operator==(&local_2d8,(char32_t (*) [6])L"delta");
  local_2d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1.0L) == U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6af,"void equality_suite::compare_real_equal_u32string_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_318,(longdouble)1);
  local_2db[0] = trial::dynamic::operator!=(&local_318,(char32_t (*) [6])L"delta");
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1.0L) != U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x6b0,"void equality_suite::compare_real_equal_u32string_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  return;
}

Assistant:

void compare_real_equal_u32string_literal()
{
    // float - u32string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) == U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0f) != U"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1.0f) == U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1.0f) != U"delta", true);
    }
    // double - u32string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) == U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0) != U"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1.0) == U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1.0) != U"delta", true);
    }
    // long double - u32string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) == U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0.0L) != U"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1.0L) == U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1.0L) != U"delta", true);
    }
}